

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9_level_stats.cc
# Opt level: O0

Vp9Level __thiscall vp9_parser::Vp9LevelStats::GetLevel(Vp9LevelStats *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int local_7c;
  int local_78;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  double grace_multiplier;
  int local_50;
  Vp9Level max_level;
  int level_index;
  int max_ref_frames;
  int min_altref_distance;
  int max_column_tiles;
  double compression_ratio;
  double max_cpb_size;
  double average_bitrate;
  int64_t max_luma_picture_breadth;
  int64_t max_luma_picture_size;
  int64_t max_luma_sample_rate;
  Vp9LevelStats *this_local;
  
  iVar4 = GetMaxLumaSampleRate(this);
  iVar5 = GetMaxLumaPictureSize(this);
  iVar6 = GetMaxLumaPictureBreadth(this);
  dVar7 = GetAverageBitRate(this);
  dVar8 = GetMaxCpbSize(this);
  dVar9 = GetCompressionRatio(this);
  iVar1 = GetMaxColumnTiles(this);
  iVar2 = GetMinimumAltrefDistance(this);
  iVar3 = GetMaxReferenceFrames(this);
  local_50 = 0;
  grace_multiplier._4_4_ = LEVEL_UNKNOWN;
  for (i_2 = 0; i_2 < 0xe; i_2 = i_2 + 1) {
    if ((double)iVar4 <=
        (double)*(long *)(Vp9LevelTable + (long)i_2 * 0x48 + 8) *
        (this->max_luma_sample_rate_grace_percent_ / 100.0 + 1.0)) {
      if (0 < *(int *)(Vp9LevelTable + (long)i_2 * 0x48)) {
        grace_multiplier._4_4_ = *(Vp9Level *)(Vp9LevelTable + (long)i_2 * 0x48);
        local_50 = i_2;
      }
      break;
    }
  }
  for (i_3 = 0; i_3 < 0xe; i_3 = i_3 + 1) {
    if (iVar5 <= *(long *)(Vp9LevelTable + (long)i_3 * 0x48 + 0x10)) {
      if ((int)grace_multiplier._4_4_ < *(int *)(Vp9LevelTable + (long)i_3 * 0x48)) {
        grace_multiplier._4_4_ = *(Vp9Level *)(Vp9LevelTable + (long)i_3 * 0x48);
        local_50 = i_3;
      }
      break;
    }
  }
  for (i_4 = 0; i_4 < 0xe; i_4 = i_4 + 1) {
    if (iVar6 <= *(long *)(Vp9LevelTable + (long)i_4 * 0x48 + 0x18)) {
      if ((int)grace_multiplier._4_4_ < *(int *)(Vp9LevelTable + (long)i_4 * 0x48)) {
        grace_multiplier._4_4_ = *(Vp9Level *)(Vp9LevelTable + (long)i_4 * 0x48);
        local_50 = i_4;
      }
      break;
    }
  }
  for (i_5 = 0; i_5 < 0xe; i_5 = i_5 + 1) {
    if (dVar7 <= *(double *)(Vp9LevelTable + (long)i_5 * 0x48 + 0x20)) {
      if ((int)grace_multiplier._4_4_ < *(int *)(Vp9LevelTable + (long)i_5 * 0x48)) {
        grace_multiplier._4_4_ = *(Vp9Level *)(Vp9LevelTable + (long)i_5 * 0x48);
        local_50 = i_5;
      }
      break;
    }
  }
  for (i_6 = 0; i_6 < 0xe; i_6 = i_6 + 1) {
    if ((0.0 < *(double *)(Vp9LevelTable + (long)i_6 * 0x48 + 0x28)) &&
       (dVar8 <= *(double *)(Vp9LevelTable + (long)i_6 * 0x48 + 0x28))) {
      if ((int)grace_multiplier._4_4_ < *(int *)(Vp9LevelTable + (long)i_6 * 0x48)) {
        grace_multiplier._4_4_ = *(Vp9Level *)(Vp9LevelTable + (long)i_6 * 0x48);
        local_50 = i_6;
      }
      break;
    }
  }
  for (local_78 = 0; local_78 < 0xe; local_78 = local_78 + 1) {
    if (iVar1 <= *(int *)(Vp9LevelTable + (long)local_78 * 0x48 + 0x38)) {
      if ((int)grace_multiplier._4_4_ < *(int *)(Vp9LevelTable + (long)local_78 * 0x48)) {
        grace_multiplier._4_4_ = *(Vp9Level *)(Vp9LevelTable + (long)local_78 * 0x48);
        local_50 = local_78;
      }
      break;
    }
  }
  local_7c = 0;
  do {
    if (0xd < local_7c) {
LAB_0012da5f:
      if (iVar2 < *(int *)(Vp9LevelTable + (long)local_50 * 0x48 + 0x3c)) {
        grace_multiplier._4_4_ = LEVEL_UNKNOWN;
      }
      if (dVar9 < *(double *)(Vp9LevelTable + (long)local_50 * 0x48 + 0x30)) {
        grace_multiplier._4_4_ = LEVEL_UNKNOWN;
      }
      return grace_multiplier._4_4_;
    }
    if (iVar3 <= *(int *)(Vp9LevelTable + (long)local_7c * 0x48 + 0x40)) {
      if ((int)grace_multiplier._4_4_ < *(int *)(Vp9LevelTable + (long)local_7c * 0x48)) {
        grace_multiplier._4_4_ = *(Vp9Level *)(Vp9LevelTable + (long)local_7c * 0x48);
        local_50 = local_7c;
      }
      goto LAB_0012da5f;
    }
    local_7c = local_7c + 1;
  } while( true );
}

Assistant:

Vp9Level Vp9LevelStats::GetLevel() const {
  const int64_t max_luma_sample_rate = GetMaxLumaSampleRate();
  const int64_t max_luma_picture_size = GetMaxLumaPictureSize();
  const int64_t max_luma_picture_breadth = GetMaxLumaPictureBreadth();
  const double average_bitrate = GetAverageBitRate();
  const double max_cpb_size = GetMaxCpbSize();
  const double compression_ratio = GetCompressionRatio();
  const int max_column_tiles = GetMaxColumnTiles();
  const int min_altref_distance = GetMinimumAltrefDistance();
  const int max_ref_frames = GetMaxReferenceFrames();

  int level_index = 0;
  Vp9Level max_level = LEVEL_UNKNOWN;
  const double grace_multiplier =
      max_luma_sample_rate_grace_percent_ / 100.0 + 1.0;
  for (int i = 0; i < kNumVp9Levels; ++i) {
    if (max_luma_sample_rate <=
        Vp9LevelTable[i].max_luma_sample_rate * grace_multiplier) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }
  for (int i = 0; i < kNumVp9Levels; ++i) {
    if (max_luma_picture_size <= Vp9LevelTable[i].max_luma_picture_size) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }
  for (int i = 0; i < kNumVp9Levels; ++i) {
    if (max_luma_picture_breadth <= Vp9LevelTable[i].max_luma_picture_breadth) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }
  for (int i = 0; i < kNumVp9Levels; ++i) {
    if (average_bitrate <= Vp9LevelTable[i].average_bitrate) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }
  for (int i = 0; i < kNumVp9Levels; ++i) {
    // Only check CPB size for levels that are defined.
    if (Vp9LevelTable[i].max_cpb_size > 0 &&
        max_cpb_size <= Vp9LevelTable[i].max_cpb_size) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }
  for (int i = 0; i < kNumVp9Levels; ++i) {
    if (max_column_tiles <= Vp9LevelTable[i].max_tiles) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }

  for (int i = 0; i < kNumVp9Levels; ++i) {
    if (max_ref_frames <= Vp9LevelTable[i].max_ref_frames) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }

  // Check if the current level meets the minimum altref distance requirement.
  // If not, set to unknown level as we can't move up a level as the minimum
  // altref distance get farther apart and we can't move down a level as we are
  // already at the minimum level for all the other requirements.
  if (min_altref_distance < Vp9LevelTable[level_index].min_altref_distance)
    max_level = LEVEL_UNKNOWN;

  // The minimum compression ratio has the same behavior as minimum altref
  // distance.
  if (compression_ratio < Vp9LevelTable[level_index].compression_ratio)
    max_level = LEVEL_UNKNOWN;
  return max_level;
}